

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

Own<const_kj::WritableFileMapping> __thiscall
kj::anon_unknown_35::InMemoryFile::mmapWritable(InMemoryFile *this,uint64_t offset,uint64_t size)

{
  Exception *this_00;
  long lVar1;
  _func_int **pp_Var2;
  _func_int *in_RCX;
  WritableFileMapping *extraout_RDX;
  Own<const_kj::WritableFileMapping> OVar3;
  AtomicRefcounted *refcounted;
  Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> lock;
  Fault local_40;
  Impl *local_38;
  
  if (!CARRY8((ulong)in_RCX,size)) {
    this_00 = (Exception *)(offset + 0x18);
    kj::_::Mutex::lock((Mutex *)this_00,EXCLUSIVE);
    local_38 = (Impl *)(offset + 0x30);
    local_40.exception = this_00;
    Impl::ensureCapacity(local_38,(size_t)(in_RCX + size));
    LOCK();
    *(int *)(offset + 0x10) = *(int *)(offset + 0x10) + 1;
    UNLOCK();
    lVar1 = *(long *)(offset + 0x38);
    pp_Var2 = (_func_int **)operator_new(0x28);
    *pp_Var2 = (_func_int *)&PTR_get_00653010;
    pp_Var2[1] = (_func_int *)(offset + 8);
    pp_Var2[2] = (_func_int *)offset;
    pp_Var2[3] = (_func_int *)(lVar1 + size);
    pp_Var2[4] = in_RCX;
    *(int *)(offset + 0x60) = *(int *)(offset + 0x60) + 1;
    (this->super_File).super_ReadableFile.super_FsNode._vptr_FsNode =
         (_func_int **)
         &kj::_::HeapDisposer<kj::(anonymous_namespace)::InMemoryFile::WritableFileMappingImpl>::
          instance;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = pp_Var2;
    kj::_::Mutex::unlock((Mutex *)this_00,EXCLUSIVE);
    OVar3.ptr = extraout_RDX;
    OVar3.disposer = (Disposer *)this;
    return OVar3;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[40]>
            (&local_40,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
             ,0x366,FAILED,"end >= offset","\"mmapWritable() request overflows uint64\"",
             (char (*) [40])"mmapWritable() request overflows uint64");
  kj::_::Debug::Fault::fatal(&local_40);
}

Assistant:

Own<const WritableFileMapping> mmapWritable(uint64_t offset, uint64_t size) const override {
    uint64_t end = offset + size;
    KJ_REQUIRE(end >= offset, "mmapWritable() request overflows uint64");
    auto lock = impl.lockExclusive();
    lock->ensureCapacity(end);
    return heap<WritableFileMappingImpl>(atomicAddRef(*this), lock->bytes.slice(offset, end));
  }